

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_read_format_zip.c
# Opt level: O0

void test_write_read_format_zip64_improved_streaming(void)

{
  int iVar1;
  void *buff_00;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  
  buff_00 = malloc(1000000);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'˥',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_zip((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˦',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                      (void *)used);
  iVar1 = archive_write_add_filter_none((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˧',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",
                      (void *)used);
  iVar1 = archive_write_set_options((archive *)used,"zip:zip64");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˨',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_options(a, \"zip:zip64\")",(void *)used);
  iVar1 = archive_write_set_options((archive *)used,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˩',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_options(a, \"zip:experimental\")",(void *)used);
  iVar1 = archive_write_open_memory((archive *)used,buff_00,1000000,&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˫',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
  write_contents((archive *)used);
  dumpfile("constructed64.zip",buff_00,buffsize);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'˳',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˴',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      (void *)used);
  iVar1 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˵',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)used);
  iVar1 = archive_read_open_memory((archive *)used,buff_00,buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˶',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  verify_contents((archive *)used,1,1);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'˺',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˻',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      (void *)used);
  iVar1 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˼',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)used);
  iVar1 = read_open_memory((archive *)used,buff_00,buffsize,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'˽',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, used, 7)",
                      (void *)used);
  verify_contents((archive *)used,0,1);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'̂',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'̃',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      (void *)used);
  iVar1 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'̄',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)used);
  iVar1 = read_open_memory_seek((archive *)used,buff_00,buffsize,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'̅',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",
                      (void *)used);
  verify_contents((archive *)used,1,1);
  free(buff_00);
  return;
}

Assistant:

DEFINE_TEST(test_write_read_format_zip64_improved_streaming)
{
	struct archive *a;
	size_t used;
	size_t buffsize = 1000000;
	char *buff;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_options(a, "zip:zip64"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));
	write_contents(a);
	dumpfile("constructed64.zip", buff, used);

	/*
	 * Now, read the data back.
	 */
	/* With the standard memory reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));
	verify_contents(a, 1, 1);

	/* With the test memory reader -- streaming mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, used, 7));
	/* Streaming reader doesn't see mode information from Central Directory. */
	verify_contents(a, 0, 1);

	/* With the test memory reader -- seeking mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, used, 7));
	verify_contents(a, 1, 1);

	free(buff);
}